

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabbox3d.h
# Opt level: O0

bool __thiscall
irr::core::aabbox3d<float>::intersectsWithBox(aabbox3d<float> *this,aabbox3d<float> *other)

{
  bool local_11;
  aabbox3d<float> *other_local;
  aabbox3d<float> *this_local;
  
  local_11 = false;
  if (((((this->MinEdge).X <= (other->MaxEdge).X) &&
       (local_11 = false, (this->MinEdge).Y <= (other->MaxEdge).Y)) &&
      (local_11 = false, (this->MinEdge).Z <= (other->MaxEdge).Z)) &&
     ((local_11 = false, (other->MinEdge).X <= (this->MaxEdge).X &&
      (local_11 = false, (other->MinEdge).Y <= (this->MaxEdge).Y)))) {
    local_11 = (other->MinEdge).Z <= (this->MaxEdge).Z;
  }
  return local_11;
}

Assistant:

bool intersectsWithBox(const aabbox3d<T> &other) const
	{
		return (MinEdge.X <= other.MaxEdge.X && MinEdge.Y <= other.MaxEdge.Y && MinEdge.Z <= other.MaxEdge.Z &&
				MaxEdge.X >= other.MinEdge.X && MaxEdge.Y >= other.MinEdge.Y && MaxEdge.Z >= other.MinEdge.Z);
	}